

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddSharedDepItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  cmGeneratorTarget *this_00;
  cmOrderDirectories *this_01;
  bool bVar1;
  TargetType TVar2;
  long lVar3;
  string lib;
  string soName;
  
  this_00 = entry->Target;
  if (this_00 == (cmGeneratorTarget *)0x0) {
    if (this->SharedDependencyMode == SharedDepModeNone) {
      return;
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar1) {
      return;
    }
    cmsys::SystemTools::GetFilenameName(&lib,(string *)entry);
    bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,lib._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&lib);
    if (!bVar1) {
      return;
    }
    if (this->SharedDependencyMode == SharedDepModeLink) goto LAB_0046e53a;
    lib._M_dataplus._M_p = (pointer)&lib.field_2;
    lib._M_string_length = 0;
    lib.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&lib);
    AddLibraryRuntimeInfo(this,&lib);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (((TVar2 == SHARED_LIBRARY) &&
        (bVar1 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar1)) &&
       (this->SharedDependencyMode != SharedDepModeLink)) {
      AddRuntimeDLL(this,this_00);
    }
    if (this->SharedDependencyMode == SharedDepModeNone) {
      return;
    }
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != SHARED_LIBRARY) {
      return;
    }
    if (this->SharedDependencyMode == SharedDepModeLink) {
LAB_0046e53a:
      AddItem(this,entry);
      return;
    }
    bVar1 = cmGeneratorTarget::IsImported(this_00);
    if (bVar1) {
      bVar1 = cmGeneratorTarget::HasKnownRuntimeArtifactLocation(this_00,&this->Config);
      if ((!bVar1) &&
         (bVar1 = cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined(this->Target,&this->Config)
         , bVar1)) goto LAB_0046e53a;
    }
    lib._M_dataplus._M_p = (pointer)&lib.field_2;
    lib._M_string_length = 0;
    lib.field_2._M_local_buf[0] = '\0';
    config = &this->Config;
    bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config);
    cmGeneratorTarget::GetFullPath(&soName,this_00,config,(uint)bVar1,false);
    std::__cxx11::string::operator=((string *)&lib,(string *)&soName);
    std::__cxx11::string::~string((string *)&soName);
    bVar1 = cmGeneratorTarget::IsApple(this_00);
    if ((bVar1) && (bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config), bVar1)) {
      cmGeneratorTarget::GetFullPath(&soName,this_00,config,RuntimeBinaryArtifact,true);
      AddLibraryRuntimeInfo(this,&soName,this_00);
      std::__cxx11::string::~string((string *)&soName);
    }
    else {
      AddLibraryRuntimeInfo(this,&lib,this_00);
    }
  }
  if (this->SharedDependencyMode == SharedDepModeDir) {
    lVar3 = 0xb10;
  }
  else if ((this->SharedDependencyMode != SharedDepModeLibDir) ||
          (lVar3 = 0xa00, this->LinkWithRuntimePath != false)) goto LAB_0046e608;
  this_01 = *(cmOrderDirectories **)
             ((long)&(this->Items).
                     super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar3);
  if (this_01 != (cmOrderDirectories *)0x0) {
    if (this_00 == (cmGeneratorTarget *)0x0) {
      cmOrderDirectories::AddRuntimeLibrary(this_01,&lib,(char *)0x0);
    }
    else {
      cmGeneratorTarget::GetSOName(&soName,this_00,&this->Config,RuntimeBinaryArtifact);
      if (soName._M_string_length != 0) {
        soName._M_string_length = (size_type)soName._M_dataplus;
      }
      cmOrderDirectories::AddRuntimeLibrary(this_01,&lib,(char *)soName._M_string_length);
      std::__cxx11::string::~string((string *)&soName);
    }
  }
LAB_0046e608:
  std::__cxx11::string::~string((string *)&lib);
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;
  const cmGeneratorTarget* tgt = entry.Target;

  // Record dependencies on DLLs.
  if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
      this->Target->IsDLLPlatform() &&
      this->SharedDependencyMode != SharedDepModeLink) {
    this->AddRuntimeDLL(tgt);
  }

  // If dropping shared library dependencies, ignore them.
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if (tgt) {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return;
    }
  } else {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if (!cmSystemTools::FileIsFullPath(item.Value)) {
      return;
    }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractSharedLibraryName.find(file)) {
      // This is not the name of a shared library.
      return;
    }
  }

  // If in linking mode, just link to the shared library.
  if (this->SharedDependencyMode == SharedDepModeLink ||
      // For an imported shared library without a known runtime artifact,
      // such as a CUDA stub, a library file named with the real soname
      // may not be available at all, so '-rpath-link' cannot help linkers
      // find it to satisfy '--no-allow-shlib-undefined' recursively.
      // Pass this dependency to the linker explicitly just in case.
      // If the linker also uses '--as-needed' behavior, this will not
      // add an unnecessary direct dependency.
      (tgt && tgt->IsImported() &&
       !tgt->HasKnownRuntimeArtifactLocation(this->Config) &&
       this->Target->LinkerEnforcesNoAllowShLibUndefined(this->Config))) {
    this->AddItem(entry);
    return;
  }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if (tgt) {
    cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    lib = tgt->GetFullPath(this->Config, artifact);
    if (tgt->IsApple() && tgt->HasImportLibrary(this->Config)) {
      // Use the library rather than the tbd file for runpath computation
      this->AddLibraryRuntimeInfo(
        tgt->GetFullPath(this->Config, cmStateEnums::RuntimeBinaryArtifact,
                         true),
        tgt);
    } else {
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    lib = item.Value;
    this->AddLibraryRuntimeInfo(lib);
  }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = nullptr;
  if (this->SharedDependencyMode == SharedDepModeLibDir &&
      !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */) {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath.get();
  } else if (this->SharedDependencyMode == SharedDepModeDir) {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath.get();
  }
  if (order) {
    if (tgt) {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty() ? nullptr : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
    } else {
      order->AddRuntimeLibrary(lib);
    }
  }
}